

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderLibrary.cpp
# Opt level: O0

void __thiscall
vkt::anon_unknown_0::ShaderCaseInstance::ShaderCaseInstance
          (ShaderCaseInstance *this,Context *context,ShaderCaseSpecification *spec)

{
  VkDescriptorSet destSet;
  VkCommandBuffer_s *pVVar1;
  deUint64 dVar2;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data_00;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data_01;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data_02;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data_03;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data_04;
  RefData<vk::Handle<(vk::HandleType)8>_> data_05;
  RefData<vk::Handle<(vk::HandleType)8>_> data_06;
  RefData<vk::Handle<(vk::HandleType)8>_> data_07;
  RefData<vk::Handle<(vk::HandleType)8>_> data_08;
  RefData<vk::Handle<(vk::HandleType)8>_> data_09;
  RefData<vk::Handle<(vk::HandleType)9>_> data_10;
  RefData<vk::Handle<(vk::HandleType)13>_> data_11;
  RefData<vk::Handle<(vk::HandleType)17>_> data_12;
  RefData<vk::Handle<(vk::HandleType)23>_> data_13;
  RefData<vk::Handle<(vk::HandleType)19>_> data_14;
  RefData<vk::Handle<(vk::HandleType)16>_> data_15;
  RefData<vk::Handle<(vk::HandleType)18>_> data_16;
  RefData<vk::Handle<(vk::HandleType)21>_> data_17;
  RefData<vk::Handle<(vk::HandleType)22>_> data_18;
  RefData<vk::Handle<(vk::HandleType)24>_> data_19;
  RefData<vk::VkCommandBuffer_s_*> data_20;
  bool bVar3;
  deUint32 shaderStages;
  VkImageLayout VVar4;
  VkResult VVar5;
  Handle<(vk::HandleType)8> *pHVar6;
  Handle<(vk::HandleType)9> *pHVar7;
  Handle<(vk::HandleType)17> *pHVar8;
  Handle<(vk::HandleType)13> *pHVar9;
  Handle<(vk::HandleType)19> *pHVar10;
  ValueBlock *inputValues;
  Handle<(vk::HandleType)16> *pHVar11;
  Handle<(vk::HandleType)21> *pHVar12;
  Handle<(vk::HandleType)24> *pHVar13;
  DeviceInterface *vk;
  Allocation *pAVar14;
  void *pvVar15;
  DeviceInterface *vkd_00;
  VkDevice pVVar16;
  VkDeviceSize offset;
  Handle<(vk::HandleType)22> *pHVar17;
  DescriptorSetUpdateBuilder *pDVar18;
  VkCommandBuffer_s **ppVVar19;
  Handle<(vk::HandleType)23> *pHVar20;
  Handle<(vk::HandleType)18> *pHVar21;
  ShaderCaseSpecification *pSVar22;
  ShaderCaseSpecification *pSVar23;
  VkClearValue VVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 local_8d0 [2];
  VkBufferMemoryBarrier copyFinishBarrier;
  undefined8 uStack_888;
  VkBufferImageCopy copyParams;
  undefined4 local_848 [2];
  VkImageMemoryBarrier renderFinishBarrier;
  Handle<(vk::HandleType)8> local_7f8;
  uint local_7ec;
  undefined8 uStack_7e8;
  deUint32 numBuffers;
  VkDeviceSize offsets [2];
  VkBuffer buffers [2];
  undefined4 local_7b0 [2];
  VkRenderPassBeginInfo passBeginInfo;
  VkClearValue clearValue;
  VkImageMemoryBarrier colorAttBarrier;
  VkMemoryBarrier vertFlushBarrier;
  undefined8 uStack_6f8;
  VkCommandBufferBeginInfo beginInfo;
  Location local_6d0;
  VkDescriptorSet local_6c8;
  DescriptorSetUpdateBuilder local_6c0;
  undefined1 local_678 [8];
  VkDescriptorBufferInfo bufInfo_1;
  DescriptorSetUpdateBuilder local_650;
  undefined1 local_608 [8];
  VkDescriptorBufferInfo bufInfo;
  undefined8 local_5e8;
  deUint16 s_indices [6];
  Vec2 s_positions [4];
  deUint32 queueFamilyIndex;
  DeviceInterface *vkd;
  Move<vk::VkCommandBuffer_s_*> local_598;
  RefData<vk::VkCommandBuffer_s_*> local_578;
  Move<vk::Handle<(vk::HandleType)24>_> local_558;
  RefData<vk::Handle<(vk::HandleType)24>_> local_538;
  deUint64 local_518;
  VkDescriptorPool local_510;
  Move<vk::Handle<(vk::HandleType)22>_> local_508;
  RefData<vk::Handle<(vk::HandleType)22>_> local_4e8;
  Move<vk::Handle<(vk::HandleType)21>_> local_4c8;
  RefData<vk::Handle<(vk::HandleType)21>_> local_4a8;
  Vector<unsigned_int,_2> local_488;
  VkPipelineLayout local_480;
  VkRenderPass local_478;
  Move<vk::Handle<(vk::HandleType)18>_> local_470;
  RefData<vk::Handle<(vk::HandleType)18>_> local_450;
  deUint64 local_430;
  Move<vk::Handle<(vk::HandleType)16>_> local_428;
  RefData<vk::Handle<(vk::HandleType)16>_> local_408;
  Move<vk::Handle<(vk::HandleType)19>_> local_3e8;
  RefData<vk::Handle<(vk::HandleType)19>_> local_3c8;
  deUint64 local_3a8;
  VkRenderPass local_3a0;
  Move<vk::Handle<(vk::HandleType)23>_> local_398;
  RefData<vk::Handle<(vk::HandleType)23>_> local_378;
  Move<vk::Handle<(vk::HandleType)17>_> local_358;
  RefData<vk::Handle<(vk::HandleType)17>_> local_338;
  deUint64 local_318;
  Move<vk::Handle<(vk::HandleType)13>_> local_310;
  RefData<vk::Handle<(vk::HandleType)13>_> local_2f0;
  deUint32 local_2cc;
  deUint64 local_2c8;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_2c0;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_2b0;
  Move<vk::Handle<(vk::HandleType)9>_> local_2a0;
  RefData<vk::Handle<(vk::HandleType)9>_> local_280;
  deUint32 local_25c;
  deUint64 local_258;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_250;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_240;
  Move<vk::Handle<(vk::HandleType)8>_> local_230;
  RefData<vk::Handle<(vk::HandleType)8>_> local_210;
  deUint32 local_1ec;
  deUint64 local_1e8;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_1e0;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_1d0;
  undefined1 local_1c0 [48];
  pointer local_190;
  pointer pVStack_188;
  deUint32 local_17c;
  pointer local_178;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_170;
  pointer local_160;
  undefined1 local_150 [48];
  pointer local_120;
  pointer pVStack_118;
  deUint32 local_10c;
  pointer local_108;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_100;
  pointer local_f0;
  undefined1 local_e0 [48];
  pointer local_b0;
  pointer pVStack_a8;
  deUint32 local_9c;
  pointer local_98;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_90;
  pointer local_80;
  Move<vk::Handle<(vk::HandleType)8>_> local_60;
  RefData<vk::Handle<(vk::HandleType)8>_> local_40;
  ShaderCaseSpecification *local_20;
  ShaderCaseSpecification *spec_local;
  Context *context_local;
  ShaderCaseInstance *this_local;
  
  local_20 = spec;
  spec_local = (ShaderCaseSpecification *)context;
  context_local = (Context *)this;
  TestInstance::TestInstance(&this->super_TestInstance,context);
  (this->super_TestInstance)._vptr_TestInstance = (_func_int **)&PTR__ShaderCaseInstance_0165a600;
  this->m_spec = local_20;
  createBuffer(&local_60,(Context *)spec_local,0x2c,0xc0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_40,(Move *)&local_60);
  uVar25 = (undefined4)local_40.object.m_internal;
  uVar26 = (undefined4)(local_40.object.m_internal >> 0x20);
  uVar27 = SUB84(local_40.deleter.m_deviceIface,0);
  uVar28 = (undefined4)((ulong)local_40.deleter.m_deviceIface >> 0x20);
  data_05.deleter.m_deviceIface._0_4_ = uVar27;
  data_05.object.m_internal = local_40.object.m_internal;
  data_05.deleter.m_deviceIface._4_4_ = uVar28;
  data_05.deleter.m_device = local_40.deleter.m_device;
  data_05.deleter.m_allocator._0_4_ = (int)local_40.deleter.m_allocator;
  data_05.deleter.m_allocator._4_4_ = (int)((ulong)local_40.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::Unique(&this->m_posNdxBuffer,data_05);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move(&local_60);
  pSVar22 = spec_local;
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     (&(this->m_posNdxBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  local_98 = (pointer)pHVar6->m_internal;
  local_9c = ::vk::MemoryRequirement::HostVisible.m_flags;
  allocateAndBindMemory
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_90,
             (Context *)pSVar22,(VkBuffer)local_98,::vk::MemoryRequirement::HostVisible);
  local_80 = (pointer)de::details::MovePtr::operator_cast_to_PtrData(&local_90,(MovePtr *)pSVar22);
  data.ptr._4_4_ = uVar26;
  data.ptr._0_4_ = uVar25;
  data._8_4_ = uVar27;
  data._12_4_ = uVar28;
  de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::UniquePtr
            (&this->m_posNdxMem,data);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_90);
  computeStd430Layout(&this->m_inputLayout,&(local_20->values).inputs);
  if ((this->m_inputLayout).size < 1) {
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::Move
              ((Move<vk::Handle<(vk::HandleType)8>_> *)local_e0);
  }
  else {
    createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)local_e0,(Context *)spec_local,
                 (long)(this->m_inputLayout).size,0x80);
  }
  pSVar22 = (ShaderCaseSpecification *)local_e0;
  ::vk::refdetails::Move::operator_cast_to_RefData
            ((RefData<vk::Handle<(vk::HandleType)8>_> *)(local_e0 + 0x20),(Move *)pSVar22);
  uVar25 = (undefined4)local_e0._32_8_;
  uVar26 = SUB84(local_e0._32_8_,4);
  uVar27 = (undefined4)local_e0._40_8_;
  uVar28 = SUB84(local_e0._40_8_,4);
  data_06.deleter.m_deviceIface._0_4_ = uVar27;
  data_06.object.m_internal = local_e0._32_8_;
  data_06.deleter.m_deviceIface._4_4_ = uVar28;
  data_06.deleter.m_device = (VkDevice)local_b0;
  data_06.deleter.m_allocator._0_4_ = (int)pVStack_a8;
  data_06.deleter.m_allocator._4_4_ = (int)((ulong)pVStack_a8 >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::Unique(&this->m_inputBuffer,data_06);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)8>_> *)local_e0);
  pSVar23 = spec_local;
  if ((this->m_inputLayout).size < 1) {
    de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::MovePtr
              ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_100);
  }
  else {
    pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                       (&(this->m_inputBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
    local_108 = (pointer)pHVar6->m_internal;
    local_10c = ::vk::MemoryRequirement::HostVisible.m_flags;
    allocateAndBindMemory
              ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_100,
               (Context *)pSVar23,(VkBuffer)local_108,::vk::MemoryRequirement::HostVisible);
    pSVar22 = pSVar23;
  }
  local_f0 = (pointer)de::details::MovePtr::operator_cast_to_PtrData(&local_100,(MovePtr *)pSVar22);
  data_00.ptr._4_4_ = uVar26;
  data_00.ptr._0_4_ = uVar25;
  data_00._8_4_ = uVar27;
  data_00._12_4_ = uVar28;
  de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::UniquePtr
            (&this->m_inputMem,data_00);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_100);
  computeStd140Layout(&this->m_referenceLayout,&(local_20->values).outputs);
  if ((this->m_referenceLayout).size < 1) {
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::Move
              ((Move<vk::Handle<(vk::HandleType)8>_> *)local_150);
  }
  else {
    createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)local_150,(Context *)spec_local,
                 (long)(this->m_referenceLayout).size,0x10);
  }
  pSVar22 = (ShaderCaseSpecification *)local_150;
  ::vk::refdetails::Move::operator_cast_to_RefData
            ((RefData<vk::Handle<(vk::HandleType)8>_> *)(local_150 + 0x20),(Move *)pSVar22);
  uVar25 = (undefined4)local_150._32_8_;
  uVar26 = SUB84(local_150._32_8_,4);
  uVar27 = (undefined4)local_150._40_8_;
  uVar28 = SUB84(local_150._40_8_,4);
  data_07.deleter.m_deviceIface._0_4_ = uVar27;
  data_07.object.m_internal = local_150._32_8_;
  data_07.deleter.m_deviceIface._4_4_ = uVar28;
  data_07.deleter.m_device = (VkDevice)local_120;
  data_07.deleter.m_allocator._0_4_ = (int)pVStack_118;
  data_07.deleter.m_allocator._4_4_ = (int)((ulong)pVStack_118 >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::Unique(&this->m_referenceBuffer,data_07)
  ;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)8>_> *)local_150);
  pSVar23 = spec_local;
  if ((this->m_referenceLayout).size < 1) {
    de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::MovePtr
              ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_170);
  }
  else {
    pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                       (&(this->m_referenceBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
    local_178 = (pointer)pHVar6->m_internal;
    local_17c = ::vk::MemoryRequirement::HostVisible.m_flags;
    allocateAndBindMemory
              ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_170,
               (Context *)pSVar23,(VkBuffer)local_178,::vk::MemoryRequirement::HostVisible);
    pSVar22 = pSVar23;
  }
  local_160 = (pointer)de::details::MovePtr::operator_cast_to_PtrData(&local_170,(MovePtr *)pSVar22)
  ;
  data_01.ptr._4_4_ = uVar26;
  data_01.ptr._0_4_ = uVar25;
  data_01._8_4_ = uVar27;
  data_01._12_4_ = uVar28;
  de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::UniquePtr
            (&this->m_referenceMem,data_01);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_170);
  computeStd140Layout(&this->m_uniformLayout,&(local_20->values).uniforms);
  if ((this->m_uniformLayout).size < 1) {
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::Move
              ((Move<vk::Handle<(vk::HandleType)8>_> *)local_1c0);
  }
  else {
    createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)local_1c0,(Context *)spec_local,
                 (long)(this->m_uniformLayout).size,0x10);
  }
  pSVar22 = (ShaderCaseSpecification *)local_1c0;
  ::vk::refdetails::Move::operator_cast_to_RefData
            ((RefData<vk::Handle<(vk::HandleType)8>_> *)(local_1c0 + 0x20),(Move *)pSVar22);
  uVar25 = (undefined4)local_1c0._32_8_;
  uVar26 = SUB84(local_1c0._32_8_,4);
  uVar27 = (undefined4)local_1c0._40_8_;
  uVar28 = SUB84(local_1c0._40_8_,4);
  data_08.deleter.m_deviceIface._0_4_ = uVar27;
  data_08.object.m_internal = local_1c0._32_8_;
  data_08.deleter.m_deviceIface._4_4_ = uVar28;
  data_08.deleter.m_device = (VkDevice)local_190;
  data_08.deleter.m_allocator._0_4_ = (int)pVStack_188;
  data_08.deleter.m_allocator._4_4_ = (int)((ulong)pVStack_188 >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::Unique(&this->m_uniformBuffer,data_08);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)8>_> *)local_1c0);
  pSVar23 = spec_local;
  if ((this->m_uniformLayout).size < 1) {
    de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::MovePtr
              ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_1e0);
  }
  else {
    pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                       (&(this->m_uniformBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
    local_1e8 = pHVar6->m_internal;
    local_1ec = ::vk::MemoryRequirement::HostVisible.m_flags;
    allocateAndBindMemory
              ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_1e0,
               (Context *)pSVar23,(VkBuffer)local_1e8,::vk::MemoryRequirement::HostVisible);
    pSVar22 = pSVar23;
  }
  local_1d0 = de::details::MovePtr::operator_cast_to_PtrData(&local_1e0,(MovePtr *)pSVar22);
  data_02.ptr._4_4_ = uVar26;
  data_02.ptr._0_4_ = uVar25;
  data_02._8_4_ = uVar27;
  data_02._12_4_ = uVar28;
  de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::UniquePtr
            (&this->m_uniformMem,data_02);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_1e0);
  createBuffer(&local_230,(Context *)spec_local,0x4000,2);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_210,(Move *)&local_230);
  uVar25 = (undefined4)local_210.object.m_internal;
  uVar26 = (undefined4)(local_210.object.m_internal >> 0x20);
  uVar27 = SUB84(local_210.deleter.m_deviceIface,0);
  uVar28 = (undefined4)((ulong)local_210.deleter.m_deviceIface >> 0x20);
  data_09.deleter.m_deviceIface._0_4_ = uVar27;
  data_09.object.m_internal = local_210.object.m_internal;
  data_09.deleter.m_deviceIface._4_4_ = uVar28;
  data_09.deleter.m_device = local_210.deleter.m_device;
  data_09.deleter.m_allocator._0_4_ = (int)local_210.deleter.m_allocator;
  data_09.deleter.m_allocator._4_4_ = (int)((ulong)local_210.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::Unique(&this->m_readImageBuffer,data_09)
  ;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move(&local_230);
  pSVar22 = spec_local;
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     (&(this->m_readImageBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  local_258 = pHVar6->m_internal;
  local_25c = ::vk::MemoryRequirement::HostVisible.m_flags;
  allocateAndBindMemory
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_250,
             (Context *)pSVar22,(VkBuffer)local_258,::vk::MemoryRequirement::HostVisible);
  local_240 = de::details::MovePtr::operator_cast_to_PtrData(&local_250,(MovePtr *)pSVar22);
  data_03.ptr._4_4_ = uVar26;
  data_03.ptr._0_4_ = uVar25;
  data_03._8_4_ = uVar27;
  data_03._12_4_ = uVar28;
  de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::UniquePtr
            (&this->m_readImageMem,data_03);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_250);
  createImage2D(&local_2a0,(Context *)spec_local,0x40,0x40,VK_FORMAT_R8G8B8A8_UNORM,
                VK_IMAGE_TILING_OPTIMAL,0x11);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_280,(Move *)&local_2a0);
  uVar25 = (undefined4)local_280.object.m_internal;
  uVar26 = (undefined4)(local_280.object.m_internal >> 0x20);
  uVar27 = SUB84(local_280.deleter.m_deviceIface,0);
  uVar28 = (undefined4)((ulong)local_280.deleter.m_deviceIface >> 0x20);
  data_10.deleter.m_deviceIface._0_4_ = uVar27;
  data_10.object.m_internal = local_280.object.m_internal;
  data_10.deleter.m_deviceIface._4_4_ = uVar28;
  data_10.deleter.m_device = local_280.deleter.m_device;
  data_10.deleter.m_allocator._0_4_ = (int)local_280.deleter.m_allocator;
  data_10.deleter.m_allocator._4_4_ = (int)((ulong)local_280.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>::Unique(&this->m_rtImage,data_10);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::~Move(&local_2a0);
  pSVar22 = spec_local;
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                     (&(this->m_rtImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  local_2c8 = pHVar7->m_internal;
  local_2cc = ::vk::MemoryRequirement::Any.m_flags;
  allocateAndBindMemory
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_2c0,
             (Context *)pSVar22,(VkImage)local_2c8,::vk::MemoryRequirement::Any);
  local_2b0 = de::details::MovePtr::operator_cast_to_PtrData(&local_2c0,(MovePtr *)pSVar22);
  data_04.ptr._4_4_ = uVar26;
  data_04.ptr._0_4_ = uVar25;
  data_04._8_4_ = uVar27;
  data_04._12_4_ = uVar28;
  de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::UniquePtr
            (&this->m_rtMem,data_04);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_2c0);
  pSVar22 = spec_local;
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                     (&(this->m_rtImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  local_318 = pHVar7->m_internal;
  createAttachmentView(&local_310,(Context *)pSVar22,(VkImage)local_318,VK_FORMAT_R8G8B8A8_UNORM);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_2f0,(Move *)&local_310);
  data_11.deleter.m_deviceIface._0_4_ = (int)local_2f0.deleter.m_deviceIface;
  data_11.object.m_internal = local_2f0.object.m_internal;
  data_11.deleter.m_deviceIface._4_4_ = (int)((ulong)local_2f0.deleter.m_deviceIface >> 0x20);
  data_11.deleter.m_device = local_2f0.deleter.m_device;
  data_11.deleter.m_allocator._0_4_ = (int)local_2f0.deleter.m_allocator;
  data_11.deleter.m_allocator._4_4_ = (int)((ulong)local_2f0.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>::Unique(&this->m_rtView,data_11);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move(&local_310);
  createRenderPass(&local_358,(Context *)spec_local,VK_FORMAT_R8G8B8A8_UNORM);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_338,(Move *)&local_358);
  data_12.deleter.m_deviceIface._0_4_ = (int)local_338.deleter.m_deviceIface;
  data_12.object.m_internal = local_338.object.m_internal;
  data_12.deleter.m_deviceIface._4_4_ = (int)((ulong)local_338.deleter.m_deviceIface >> 0x20);
  data_12.deleter.m_device = local_338.deleter.m_device;
  data_12.deleter.m_allocator._0_4_ = (int)local_338.deleter.m_allocator;
  data_12.deleter.m_allocator._4_4_ = (int)((ulong)local_338.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)17>_>::Unique(&this->m_renderPass,data_12);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)17>_>::~Move(&local_358);
  pSVar22 = spec_local;
  pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                     (&(this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>);
  local_3a0.m_internal = pHVar8->m_internal;
  pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::operator*
                     (&(this->m_rtView).super_RefBase<vk::Handle<(vk::HandleType)13>_>);
  local_3a8 = pHVar9->m_internal;
  createFramebuffer(&local_398,(Context *)pSVar22,local_3a0,(VkImageView)local_3a8,0x40,0x40);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_378,(Move *)&local_398);
  data_13.deleter.m_deviceIface._0_4_ = (int)local_378.deleter.m_deviceIface;
  data_13.object.m_internal = local_378.object.m_internal;
  data_13.deleter.m_deviceIface._4_4_ = (int)((ulong)local_378.deleter.m_deviceIface >> 0x20);
  data_13.deleter.m_device = local_378.deleter.m_device;
  data_13.deleter.m_allocator._0_4_ = (int)local_378.deleter.m_allocator;
  data_13.deleter.m_allocator._4_4_ = (int)((ulong)local_378.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>::Unique(&this->m_framebuffer,data_13);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::~Move(&local_398);
  PipelineProgram::PipelineProgram(&this->m_program,(Context *)spec_local,local_20);
  pSVar22 = spec_local;
  shaderStages = PipelineProgram::getStages(&this->m_program);
  createDescriptorSetLayout(&local_3e8,(Context *)pSVar22,shaderStages);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_3c8,(Move *)&local_3e8);
  data_14.deleter.m_deviceIface._0_4_ = (int)local_3c8.deleter.m_deviceIface;
  data_14.object.m_internal = local_3c8.object.m_internal;
  data_14.deleter.m_deviceIface._4_4_ = (int)((ulong)local_3c8.deleter.m_deviceIface >> 0x20);
  data_14.deleter.m_device = local_3c8.deleter.m_device;
  data_14.deleter.m_allocator._0_4_ = (int)local_3c8.deleter.m_allocator;
  data_14.deleter.m_allocator._4_4_ = (int)((ulong)local_3c8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>::Unique
            (&this->m_descriptorSetLayout,data_14);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::~Move(&local_3e8);
  pSVar22 = spec_local;
  pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                      (&(this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>
                      );
  local_430 = pHVar10->m_internal;
  createPipelineLayout(&local_428,(Context *)pSVar22,(VkDescriptorSetLayout)local_430);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_408,(Move *)&local_428);
  data_15.deleter.m_deviceIface._0_4_ = (int)local_408.deleter.m_deviceIface;
  data_15.object.m_internal = local_408.object.m_internal;
  data_15.deleter.m_deviceIface._4_4_ = (int)((ulong)local_408.deleter.m_deviceIface >> 0x20);
  data_15.deleter.m_device = local_408.deleter.m_device;
  data_15.deleter.m_allocator._0_4_ = (int)local_408.deleter.m_allocator;
  data_15.deleter.m_allocator._4_4_ = (int)((ulong)local_408.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::Unique(&this->m_pipelineLayout,data_15)
  ;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move(&local_428);
  pSVar22 = spec_local;
  inputValues = &local_20->values;
  pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                     (&(this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>);
  local_478.m_internal = pHVar8->m_internal;
  pHVar11 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                      (&(this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>);
  local_480.m_internal = pHVar11->m_internal;
  tcu::Vector<unsigned_int,_2>::Vector(&local_488,0x40,0x40);
  createPipeline(&local_470,(Context *)pSVar22,&inputValues->inputs,&this->m_inputLayout,
                 &this->m_program,local_478,local_480,&local_488);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_450,(Move *)&local_470);
  data_16.deleter.m_deviceIface._0_4_ = (int)local_450.deleter.m_deviceIface;
  data_16.object.m_internal = local_450.object.m_internal;
  data_16.deleter.m_deviceIface._4_4_ = (int)((ulong)local_450.deleter.m_deviceIface >> 0x20);
  data_16.deleter.m_device = local_450.deleter.m_device;
  data_16.deleter.m_allocator._0_4_ = (int)local_450.deleter.m_allocator;
  data_16.deleter.m_allocator._4_4_ = (int)((ulong)local_450.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::Unique(&this->m_pipeline,data_16);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_470);
  createDescriptorPool(&local_4c8,(Context *)spec_local);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_4a8,(Move *)&local_4c8);
  data_17.deleter.m_deviceIface._0_4_ = (int)local_4a8.deleter.m_deviceIface;
  data_17.object.m_internal = local_4a8.object.m_internal;
  data_17.deleter.m_deviceIface._4_4_ = (int)((ulong)local_4a8.deleter.m_deviceIface >> 0x20);
  data_17.deleter.m_device = local_4a8.deleter.m_device;
  data_17.deleter.m_allocator._0_4_ = (int)local_4a8.deleter.m_allocator;
  data_17.deleter.m_allocator._4_4_ = (int)((ulong)local_4a8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>::Unique(&this->m_descriptorPool,data_17)
  ;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::~Move(&local_4c8);
  pSVar22 = spec_local;
  pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::operator*
                      (&(this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>);
  local_510.m_internal = pHVar12->m_internal;
  pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                      (&(this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>
                      );
  local_518 = pHVar10->m_internal;
  allocateDescriptorSet(&local_508,(Context *)pSVar22,local_510,(VkDescriptorSetLayout)local_518);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_4e8,(Move *)&local_508);
  data_18.deleter.m_deviceIface._0_4_ = (int)local_4e8.deleter.m_deviceIface;
  data_18.object.m_internal = local_4e8.object.m_internal;
  data_18.deleter.m_deviceIface._4_4_ = (int)((ulong)local_4e8.deleter.m_deviceIface >> 0x20);
  data_18.deleter.m_device = local_4e8.deleter.m_device;
  data_18.deleter.m_pool.m_internal._0_4_ = (int)local_4e8.deleter.m_pool.m_internal;
  data_18.deleter.m_pool.m_internal._4_4_ = (int)(local_4e8.deleter.m_pool.m_internal >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::Unique(&this->m_descriptorSet,data_18);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move(&local_508);
  createCommandPool(&local_558,(Context *)spec_local);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_538,(Move *)&local_558);
  data_19.deleter.m_deviceIface._0_4_ = (int)local_538.deleter.m_deviceIface;
  data_19.object.m_internal = local_538.object.m_internal;
  data_19.deleter.m_deviceIface._4_4_ = (int)((ulong)local_538.deleter.m_deviceIface >> 0x20);
  data_19.deleter.m_device = local_538.deleter.m_device;
  data_19.deleter.m_allocator._0_4_ = (int)local_538.deleter.m_allocator;
  data_19.deleter.m_allocator._4_4_ = (int)((ulong)local_538.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique(&this->m_cmdPool,data_19);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move(&local_558);
  pSVar22 = spec_local;
  pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                      (&(this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>);
  allocateCommandBuffer(&local_598,(Context *)pSVar22,(VkCommandPool)pHVar13->m_internal);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_578,(Move *)&local_598);
  data_20.deleter.m_deviceIface._0_4_ = (int)local_578.deleter.m_deviceIface;
  data_20.object = local_578.object;
  data_20.deleter.m_deviceIface._4_4_ = (int)((ulong)local_578.deleter.m_deviceIface >> 0x20);
  data_20.deleter.m_device = local_578.deleter.m_device;
  data_20.deleter.m_pool.m_internal._0_4_ = (int)local_578.deleter.m_pool.m_internal;
  data_20.deleter.m_pool.m_internal._4_4_ = (int)(local_578.deleter.m_pool.m_internal >> 0x20);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique(&this->m_cmdBuffer,data_20);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_598);
  this->m_subCaseNdx = 0;
  vk = Context::getDeviceInterface((Context *)spec_local);
  VVar4 = Context::getUniversalQueueFamilyIndex((Context *)spec_local);
  tcu::Vector<float,_2>::Vector((Vector<float,_2> *)(s_indices + 4),-1.0,-1.0);
  tcu::Vector<float,_2>::Vector(s_positions,-1.0,1.0);
  tcu::Vector<float,_2>::Vector(s_positions + 1,1.0,-1.0);
  tcu::Vector<float,_2>::Vector(s_positions + 2,1.0,1.0);
  local_5e8 = 0x1000200010000;
  s_indices[0] = 3;
  s_indices[1] = 2;
  pAVar14 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      (&(this->m_posNdxMem).
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  pvVar15 = ::vk::Allocation::getHostPtr(pAVar14);
  ::deMemcpy(pvVar15,s_indices + 4,0x20);
  pAVar14 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      (&(this->m_posNdxMem).
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  pvVar15 = ::vk::Allocation::getHostPtr(pAVar14);
  ::deMemcpy((void *)((long)pvVar15 + 0x20),&local_5e8,0xc);
  vkd_00 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar16 = Context::getDevice((Context *)spec_local);
  pAVar14 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      (&(this->m_posNdxMem).
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  bufInfo.range = (VkDeviceSize)::vk::Allocation::getMemory(pAVar14);
  pAVar14 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      (&(this->m_posNdxMem).
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  offset = ::vk::Allocation::getOffset(pAVar14);
  ::vk::flushMappedMemoryRange(vkd_00,pVVar16,(VkDeviceMemory)bufInfo.range,offset,0x2c);
  bVar3 = std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::empty
                    (&(this->m_spec->values).uniforms);
  if (!bVar3) {
    pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                       (&(this->m_uniformBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
    local_608 = (undefined1  [8])pHVar6->m_internal;
    bufInfo.buffer.m_internal = 0;
    bufInfo.offset = (VkDeviceSize)(this->m_uniformLayout).size;
    ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder(&local_650);
    pHVar17 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                        (&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>);
    destSet.m_internal = pHVar17->m_internal;
    bufInfo_1.range = (VkDeviceSize)::vk::DescriptorSetUpdateBuilder::Location::binding(1);
    pDVar18 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                        (&local_650,destSet,(Location *)&bufInfo_1.range,
                         VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,(VkDescriptorBufferInfo *)local_608);
    pVVar16 = Context::getDevice((this->super_TestInstance).m_context);
    ::vk::DescriptorSetUpdateBuilder::update(pDVar18,vk,pVVar16);
    ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder(&local_650);
  }
  bVar3 = std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::empty
                    (&(this->m_spec->values).outputs);
  if (!bVar3) {
    pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                       (&(this->m_referenceBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
    local_678 = (undefined1  [8])pHVar6->m_internal;
    bufInfo_1.buffer.m_internal = 0;
    bufInfo_1.offset = (VkDeviceSize)(this->m_referenceLayout).size;
    ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder(&local_6c0);
    pHVar17 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                        (&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>);
    local_6c8.m_internal = pHVar17->m_internal;
    local_6d0 = ::vk::DescriptorSetUpdateBuilder::Location::binding(0);
    pDVar18 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                        (&local_6c0,local_6c8,&local_6d0,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,
                         (VkDescriptorBufferInfo *)local_678);
    pVVar16 = Context::getDevice((this->super_TestInstance).m_context);
    ::vk::DescriptorSetUpdateBuilder::update(pDVar18,vk,pVVar16);
    ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder(&local_6c0);
  }
  beginInfo.pNext = (void *)0x0;
  beginInfo.flags = 0;
  beginInfo._20_4_ = 0;
  uStack_6f8 = 0x2a;
  beginInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  beginInfo._4_4_ = 0;
  ppVVar19 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  VVar5 = (*vk->_vptr_DeviceInterface[0x49])(vk,*ppVVar19,&uStack_6f8);
  ::vk::checkResult(VVar5,"vkd.beginCommandBuffer(*m_cmdBuffer, &beginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/vktShaderLibrary.cpp"
                    ,0x5c2);
  colorAttBarrier.subresourceRange.layerCount = 0x2e;
  colorAttBarrier._68_4_ = 0;
  clearValue._8_4_ = 0x2d;
  colorAttBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  colorAttBarrier._4_4_ = 0;
  colorAttBarrier.pNext._0_4_ = 0;
  colorAttBarrier.pNext._4_4_ = 0x100;
  colorAttBarrier.srcAccessMask = 0;
  colorAttBarrier.dstAccessMask = 2;
  colorAttBarrier.oldLayout = VVar4;
  colorAttBarrier.newLayout = VVar4;
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                     (&(this->m_rtImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  colorAttBarrier._32_8_ = pHVar7->m_internal;
  colorAttBarrier.image.m_internal._0_4_ = 1;
  colorAttBarrier.image.m_internal._4_4_ = 0;
  colorAttBarrier.subresourceRange.aspectMask = 1;
  colorAttBarrier.subresourceRange.baseMipLevel = 0;
  colorAttBarrier.subresourceRange.levelCount = 1;
  ppVVar19 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,*ppVVar19,0x4000,0x8000,0,1,(int)&colorAttBarrier.subresourceRange.layerCount,0,0,1,
             (long)&clearValue + 8);
  VVar24 = ::vk::makeClearValueColorF32(0.125,0.25,0.75,1.0);
  clearValue.depthStencil = (VkClearDepthStencilValue)VVar24._8_8_;
  passBeginInfo.pClearValues = (VkClearValue *)VVar24.depthStencil;
  local_7b0[0] = 0x2b;
  passBeginInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  passBeginInfo._4_4_ = 0;
  pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                     (&(this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>);
  passBeginInfo.pNext = (void *)pHVar8->m_internal;
  pHVar20 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::operator*
                      (&(this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>);
  passBeginInfo.renderPass.m_internal = pHVar20->m_internal;
  passBeginInfo.framebuffer.m_internal._0_4_ = 0;
  passBeginInfo.framebuffer.m_internal._4_4_ = 0;
  passBeginInfo.renderArea.offset.x = 0x40;
  passBeginInfo.renderArea.offset.y = 0x40;
  passBeginInfo.renderArea.extent.width = 1;
  passBeginInfo._48_8_ = &passBeginInfo.pClearValues;
  ppVVar19 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  (*vk->_vptr_DeviceInterface[0x74])(vk,*ppVVar19,local_7b0,0);
  ppVVar19 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  pVVar1 = *ppVVar19;
  pHVar21 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                      (&(this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>);
  (*vk->_vptr_DeviceInterface[0x4c])(vk,pVVar1,0,pHVar21->m_internal);
  bVar3 = std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::empty
                    (&(this->m_spec->values).uniforms);
  if ((!bVar3) ||
     (bVar3 = std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::empty
                        (&(this->m_spec->values).outputs), !bVar3)) {
    ppVVar19 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
    pVVar1 = *ppVVar19;
    pHVar11 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                        (&(this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>);
    dVar2 = pHVar11->m_internal;
    pHVar17 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                        (&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>);
    (*vk->_vptr_DeviceInterface[0x56])(vk,pVVar1,0,dVar2,0,1,(int)pHVar17,0,0);
  }
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     (&(this->m_posNdxBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  offsets[1] = pHVar6->m_internal;
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     (&(this->m_inputBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  buffers[0].m_internal = pHVar6->m_internal;
  uStack_7e8 = 0;
  offsets[0] = 0;
  ::vk::Handle<(vk::HandleType)8>::Handle(&local_7f8,0);
  bVar3 = ::vk::Handle<(vk::HandleType)8>::operator!=(buffers,&local_7f8);
  local_7ec = bVar3 + 1;
  ppVVar19 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  (*vk->_vptr_DeviceInterface[0x58])
            (vk,*ppVVar19,0,(ulong)local_7ec,offsets + 1,&stack0xfffffffffffff818);
  ppVVar19 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  pVVar1 = *ppVVar19;
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     (&(this->m_posNdxBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  renderFinishBarrier._64_8_ = pHVar6->m_internal;
  (*vk->_vptr_DeviceInterface[0x57])(vk,pVVar1,renderFinishBarrier._64_8_,0x20,0);
  ppVVar19 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  (*vk->_vptr_DeviceInterface[0x5a])(vk,*ppVVar19,6,1,0,0,0);
  ppVVar19 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  (*vk->_vptr_DeviceInterface[0x76])(vk,*ppVVar19);
  local_848[0] = 0x2d;
  renderFinishBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  renderFinishBarrier._4_4_ = 0;
  renderFinishBarrier.pNext._0_4_ = 0x100;
  renderFinishBarrier.pNext._4_4_ = 0x800;
  renderFinishBarrier.srcAccessMask = 2;
  renderFinishBarrier.dstAccessMask = 6;
  renderFinishBarrier.oldLayout = VVar4;
  renderFinishBarrier.newLayout = VVar4;
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                     (&(this->m_rtImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  renderFinishBarrier._32_8_ = pHVar7->m_internal;
  renderFinishBarrier.image.m_internal._0_4_ = 1;
  renderFinishBarrier.image.m_internal._4_4_ = 0;
  renderFinishBarrier.subresourceRange.aspectMask = 1;
  renderFinishBarrier.subresourceRange.baseMipLevel = 0;
  renderFinishBarrier.subresourceRange.levelCount = 1;
  ppVVar19 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  (*vk->_vptr_DeviceInterface[0x6d])(vk,*ppVVar19,0x8000,0x1000,0,0,0,0,0,1,local_848);
  copyParams.imageSubresource.baseArrayLayer = 0;
  copyParams.imageSubresource.layerCount = 0;
  copyParams.imageOffset.x = 0;
  copyParams.imageOffset.y = 0x40;
  copyParams.bufferRowLength = 1;
  copyParams.bufferImageHeight = 0;
  copyParams.imageSubresource.aspectMask = 0;
  copyParams.imageSubresource.mipLevel = 1;
  uStack_888 = 0;
  copyParams.bufferOffset = 0x4000000040;
  copyParams.imageOffset.z = 0x40;
  copyParams.imageExtent.width = 1;
  ppVVar19 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  pVVar1 = *ppVVar19;
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                     (&(this->m_rtImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  dVar2 = pHVar7->m_internal;
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     (&(this->m_readImageBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  copyFinishBarrier.size = pHVar6->m_internal;
  (*vk->_vptr_DeviceInterface[99])(vk,pVVar1,dVar2,6,copyFinishBarrier.size,1,(int)&uStack_888);
  local_8d0[0] = 0x2c;
  copyFinishBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  copyFinishBarrier._4_4_ = 0;
  copyFinishBarrier.pNext._0_4_ = 0x1000;
  copyFinishBarrier.pNext._4_4_ = 0x2000;
  copyFinishBarrier.srcAccessMask = VVar4;
  copyFinishBarrier.dstAccessMask = VVar4;
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     (&(this->m_readImageBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  copyFinishBarrier._24_8_ = pHVar6->m_internal;
  copyFinishBarrier.buffer.m_internal = 0;
  copyFinishBarrier.offset = 0x4000;
  ppVVar19 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  (*vk->_vptr_DeviceInterface[0x6d])(vk,*ppVVar19,0x1000,0x4000,0,0,0,1,local_8d0,0,0);
  ppVVar19 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  VVar5 = (*vk->_vptr_DeviceInterface[0x4a])(vk,*ppVVar19);
  ::vk::checkResult(VVar5,"vkd.endCommandBuffer(*m_cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/vktShaderLibrary.cpp"
                    ,0x649);
  return;
}

Assistant:

ShaderCaseInstance::ShaderCaseInstance (Context& context, const ShaderCaseSpecification& spec)
	: TestInstance			(context)
	, m_spec				(spec)

	, m_posNdxBuffer		(createBuffer(context, (vk::VkDeviceSize)TOTAL_POS_NDX_SIZE, vk::VK_BUFFER_USAGE_INDEX_BUFFER_BIT|vk::VK_BUFFER_USAGE_VERTEX_BUFFER_BIT))
	, m_posNdxMem			(allocateAndBindMemory(context, *m_posNdxBuffer, vk::MemoryRequirement::HostVisible))

	, m_inputLayout			(computeStd430Layout(spec.values.inputs))
	, m_inputBuffer			(m_inputLayout.size > 0 ? createBuffer(context, (vk::VkDeviceSize)m_inputLayout.size, vk::VK_BUFFER_USAGE_VERTEX_BUFFER_BIT) : Move<vk::VkBuffer>())
	, m_inputMem			(m_inputLayout.size > 0 ? allocateAndBindMemory(context, *m_inputBuffer, vk::MemoryRequirement::HostVisible) : MovePtr<vk::Allocation>())

	, m_referenceLayout		(computeStd140Layout(spec.values.outputs))
	, m_referenceBuffer		(m_referenceLayout.size > 0 ? createBuffer(context, (vk::VkDeviceSize)m_referenceLayout.size, vk::VK_BUFFER_USAGE_UNIFORM_BUFFER_BIT) : Move<vk::VkBuffer>())
	, m_referenceMem		(m_referenceLayout.size > 0 ? allocateAndBindMemory(context, *m_referenceBuffer, vk::MemoryRequirement::HostVisible) : MovePtr<vk::Allocation>())

	, m_uniformLayout		(computeStd140Layout(spec.values.uniforms))
	, m_uniformBuffer		(m_uniformLayout.size > 0 ? createBuffer(context, (vk::VkDeviceSize)m_uniformLayout.size, vk::VK_BUFFER_USAGE_UNIFORM_BUFFER_BIT) : Move<vk::VkBuffer>())
	, m_uniformMem			(m_uniformLayout.size > 0 ? allocateAndBindMemory(context, *m_uniformBuffer, vk::MemoryRequirement::HostVisible) : MovePtr<vk::Allocation>())

	, m_readImageBuffer		(createBuffer(context, (vk::VkDeviceSize)(RENDER_WIDTH*RENDER_HEIGHT*4), vk::VK_BUFFER_USAGE_TRANSFER_DST_BIT))
	, m_readImageMem		(allocateAndBindMemory(context, *m_readImageBuffer, vk::MemoryRequirement::HostVisible))

	, m_rtImage				(createImage2D(context, RENDER_WIDTH, RENDER_HEIGHT, vk::VK_FORMAT_R8G8B8A8_UNORM, vk::VK_IMAGE_TILING_OPTIMAL, vk::VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT|vk::VK_IMAGE_USAGE_TRANSFER_SRC_BIT))
	, m_rtMem				(allocateAndBindMemory(context, *m_rtImage, vk::MemoryRequirement::Any))
	, m_rtView				(createAttachmentView(context, *m_rtImage, vk::VK_FORMAT_R8G8B8A8_UNORM))

	, m_renderPass			(createRenderPass(context, vk::VK_FORMAT_R8G8B8A8_UNORM))
	, m_framebuffer			(createFramebuffer(context, *m_renderPass, *m_rtView, RENDER_WIDTH, RENDER_HEIGHT))
	, m_program				(context, spec)
	, m_descriptorSetLayout	(createDescriptorSetLayout(context, m_program.getStages()))
	, m_pipelineLayout		(createPipelineLayout(context, *m_descriptorSetLayout))
	, m_pipeline			(createPipeline(context, spec.values.inputs, m_inputLayout, m_program, *m_renderPass, *m_pipelineLayout, tcu::UVec2(RENDER_WIDTH, RENDER_HEIGHT)))

	, m_descriptorPool		(createDescriptorPool(context))
	, m_descriptorSet		(allocateDescriptorSet(context, *m_descriptorPool, *m_descriptorSetLayout))

	, m_cmdPool				(createCommandPool(context))
	, m_cmdBuffer			(allocateCommandBuffer(context, *m_cmdPool))

	, m_subCaseNdx			(0)
{
	const vk::DeviceInterface&	vkd					= context.getDeviceInterface();
	const deUint32				queueFamilyIndex	= context.getUniversalQueueFamilyIndex();

	{
		const Vec2			s_positions[]	=
		{
			Vec2(-1.0f, -1.0f),
			Vec2(-1.0f, +1.0f),
			Vec2(+1.0f, -1.0f),
			Vec2(+1.0f, +1.0f)
		};
		const deUint16		s_indices[]		=
		{
			0, 1, 2,
			1, 3, 2
		};

		DE_STATIC_ASSERT(sizeof(s_positions) == POSITIONS_SIZE);
		DE_STATIC_ASSERT(sizeof(s_indices) == INDICES_SIZE);

		deMemcpy((deUint8*)m_posNdxMem->getHostPtr() + POSITIONS_OFFSET,	&s_positions[0],	sizeof(s_positions));
		deMemcpy((deUint8*)m_posNdxMem->getHostPtr() + INDICES_OFFSET,		&s_indices[0],		sizeof(s_indices));

		flushMappedMemoryRange(m_context.getDeviceInterface(), context.getDevice(), m_posNdxMem->getMemory(), m_posNdxMem->getOffset(), sizeof(s_positions)+sizeof(s_indices));
	}

	if (!m_spec.values.uniforms.empty())
	{
		const vk::VkDescriptorBufferInfo	bufInfo	=
		{
			*m_uniformBuffer,
			(vk::VkDeviceSize)0,	// offset
			(vk::VkDeviceSize)m_uniformLayout.size
		};

		vk::DescriptorSetUpdateBuilder()
			.writeSingle(*m_descriptorSet, vk::DescriptorSetUpdateBuilder::Location::binding(USER_UNIFORM_BINDING),
						 vk::VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, &bufInfo)
			.update(vkd, m_context.getDevice());
	}

	if (!m_spec.values.outputs.empty())
	{
		const vk::VkDescriptorBufferInfo	bufInfo	=
		{
			*m_referenceBuffer,
			(vk::VkDeviceSize)0,	// offset
			(vk::VkDeviceSize)m_referenceLayout.size
		};

		vk::DescriptorSetUpdateBuilder()
			.writeSingle(*m_descriptorSet, vk::DescriptorSetUpdateBuilder::Location::binding(REFERENCE_UNIFORM_BINDING),
						 vk::VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, &bufInfo)
			.update(vkd, m_context.getDevice());
	}

	// Record command buffer

	{
		const vk::VkCommandBufferBeginInfo beginInfo	=
		{
			vk::VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,	// sType
			DE_NULL,											// pNext
			0u,													// flags
			(const vk::VkCommandBufferInheritanceInfo*)DE_NULL,
		};

		VK_CHECK(vkd.beginCommandBuffer(*m_cmdBuffer, &beginInfo));
	}

	{
		const vk::VkMemoryBarrier		vertFlushBarrier	=
		{
			vk::VK_STRUCTURE_TYPE_MEMORY_BARRIER,													// sType
			DE_NULL,																				// pNext
			vk::VK_ACCESS_HOST_WRITE_BIT,															// srcAccessMask
			vk::VK_ACCESS_VERTEX_ATTRIBUTE_READ_BIT|vk::VK_ACCESS_UNIFORM_READ_BIT,					// dstAccessMask
		};
		const vk::VkImageMemoryBarrier	colorAttBarrier		=
		{
			vk::VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,		// sType
			DE_NULL,										// pNext
			0u,												// srcAccessMask
			vk::VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,		// dstAccessMask
			vk::VK_IMAGE_LAYOUT_UNDEFINED,					// oldLayout
			vk::VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,	// newLayout
			queueFamilyIndex,								// srcQueueFamilyIndex
			queueFamilyIndex,								// destQueueFamilyIndex
			*m_rtImage,										// image
			{
				vk::VK_IMAGE_ASPECT_COLOR_BIT,					// aspectMask
				0u,												// baseMipLevel
				1u,												// mipLevels
				0u,												// baseArraySlice
				1u,												// arraySize
			}												// subresourceRange
		};

		vkd.cmdPipelineBarrier(*m_cmdBuffer, vk::VK_PIPELINE_STAGE_HOST_BIT, vk::VK_PIPELINE_STAGE_ALL_GRAPHICS_BIT, (vk::VkDependencyFlags)0,
							   1, &vertFlushBarrier,
							   0, (const vk::VkBufferMemoryBarrier*)DE_NULL,
							   1, &colorAttBarrier);
	}

	{
		const vk::VkClearValue			clearValue		= vk::makeClearValueColorF32(0.125f, 0.25f, 0.75f, 1.0f);
		const vk::VkRenderPassBeginInfo	passBeginInfo	=
		{
			vk::VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO,	// sType
			DE_NULL,										// pNext
			*m_renderPass,									// renderPass
			*m_framebuffer,									// framebuffer
			{ { 0, 0 }, { RENDER_WIDTH, RENDER_HEIGHT } },	// renderArea
			1u,												// clearValueCount
			&clearValue,									// pClearValues
		};

		vkd.cmdBeginRenderPass(*m_cmdBuffer, &passBeginInfo, vk::VK_SUBPASS_CONTENTS_INLINE);
	}

	vkd.cmdBindPipeline(*m_cmdBuffer, vk::VK_PIPELINE_BIND_POINT_GRAPHICS, *m_pipeline);

	if (!m_spec.values.uniforms.empty() || !m_spec.values.outputs.empty())
		vkd.cmdBindDescriptorSets(*m_cmdBuffer, vk::VK_PIPELINE_BIND_POINT_GRAPHICS, *m_pipelineLayout, 0u, 1u, &*m_descriptorSet, 0u, DE_NULL);

	{
		const vk::VkBuffer		buffers[]	= { *m_posNdxBuffer, *m_inputBuffer };
		const vk::VkDeviceSize	offsets[]	= { POSITIONS_OFFSET, 0u };
		const deUint32			numBuffers	= buffers[1] != 0 ? 2u : 1u;
		vkd.cmdBindVertexBuffers(*m_cmdBuffer, 0u, numBuffers, buffers, offsets);
	}

	vkd.cmdBindIndexBuffer	(*m_cmdBuffer, *m_posNdxBuffer, (vk::VkDeviceSize)INDICES_OFFSET, vk::VK_INDEX_TYPE_UINT16);
	vkd.cmdDrawIndexed		(*m_cmdBuffer, 6u, 1u, 0u, 0u, 0u);
	vkd.cmdEndRenderPass	(*m_cmdBuffer);

	{
		const vk::VkImageMemoryBarrier	renderFinishBarrier	=
		{
			vk::VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,		// sType
			DE_NULL,										// pNext
			vk::VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,		// srcAccessMask
			vk::VK_ACCESS_TRANSFER_READ_BIT,				// dstAccessMask
			vk::VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,	// oldLayout
			vk::VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,		// newLayout
			queueFamilyIndex,								// srcQueueFamilyIndex
			queueFamilyIndex,								// destQueueFamilyIndex
			*m_rtImage,										// image
			{
				vk::VK_IMAGE_ASPECT_COLOR_BIT,					// aspectMask
				0u,												// baseMipLevel
				1u,												// mipLevels
				0u,												// baseArraySlice
				1u,												// arraySize
			}												// subresourceRange
		};

		vkd.cmdPipelineBarrier(*m_cmdBuffer, vk::VK_PIPELINE_STAGE_ALL_GRAPHICS_BIT, vk::VK_PIPELINE_STAGE_TRANSFER_BIT, (vk::VkDependencyFlags)0,
							   0, (const vk::VkMemoryBarrier*)DE_NULL,
							   0, (const vk::VkBufferMemoryBarrier*)DE_NULL,
							   1, &renderFinishBarrier);
	}

	{
		const vk::VkBufferImageCopy	copyParams	=
		{
			(vk::VkDeviceSize)0u,					// bufferOffset
			(deUint32)RENDER_WIDTH,					// bufferRowLength
			(deUint32)RENDER_HEIGHT,				// bufferImageHeight
			{
				vk::VK_IMAGE_ASPECT_COLOR_BIT,			// aspect
				0u,										// mipLevel
				0u,										// arrayLayer
				1u,										// arraySize
			},										// imageSubresource
			{ 0u, 0u, 0u },							// imageOffset
			{ RENDER_WIDTH, RENDER_HEIGHT, 1u }		// imageExtent
		};

		vkd.cmdCopyImageToBuffer(*m_cmdBuffer, *m_rtImage, vk::VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *m_readImageBuffer, 1u, &copyParams);
	}

	{
		const vk::VkBufferMemoryBarrier	copyFinishBarrier	=
		{
			vk::VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,		// sType
			DE_NULL,											// pNext
			vk::VK_ACCESS_TRANSFER_WRITE_BIT,					// srcAccessMask
			vk::VK_ACCESS_HOST_READ_BIT,						// dstAccessMask
			queueFamilyIndex,									// srcQueueFamilyIndex
			queueFamilyIndex,									// destQueueFamilyIndex
			*m_readImageBuffer,									// buffer
			0u,													// offset
			(vk::VkDeviceSize)(RENDER_WIDTH*RENDER_HEIGHT*4)	// size
		};

		vkd.cmdPipelineBarrier(*m_cmdBuffer, vk::VK_PIPELINE_STAGE_TRANSFER_BIT, vk::VK_PIPELINE_STAGE_HOST_BIT, (vk::VkDependencyFlags)0,
							   0, (const vk::VkMemoryBarrier*)DE_NULL,
							   1, &copyFinishBarrier,
							   0, (const vk::VkImageMemoryBarrier*)DE_NULL);
	}

	VK_CHECK(vkd.endCommandBuffer(*m_cmdBuffer));
}